

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9CachePolicyULT.cpp
# Opt level: O0

void __thiscall CTestGen9CachePolicy::CheckLlcEdramCachePolicy(CTestGen9CachePolicy *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_2a8;
  Message local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_13;
  Message local_278;
  uint local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_12;
  Message local_250;
  uint local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_11;
  Message local_228;
  uint local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_10;
  Message local_200;
  uint local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_9;
  Message local_1d8;
  uint local_1cc;
  ulong local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_8;
  Message local_1a8;
  uint local_1a0 [2];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_7;
  Message local_180;
  uint local_178 [2];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_6;
  Message local_158;
  uint local_150 [2];
  undefined1 local_148 [8];
  AssertionResult gtest_ar_5;
  Message local_130;
  uint local_128 [2];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_4;
  Message local_108;
  uint local_100 [2];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  uint local_d8 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  uint local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  uint local_78 [2];
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  GMM_CACHE_POLICY_TBL_ELEMENT Mocs;
  uint32_t AssignedMocsIdx;
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint32_t Usage;
  uint32_t LeCC_WB_CACHEABLE;
  uint32_t LeCC_UNCACHEABLE;
  uint32_t TargetCache_LLC_ELLC;
  uint32_t TargetCache_LLC;
  uint32_t TargetCache_ELLC;
  CTestGen9CachePolicy *this_local;
  
  TargetCache_LLC_ELLC = 0;
  LeCC_UNCACHEABLE = 1;
  LeCC_WB_CACHEABLE = 2;
  Usage = 1;
  ClientRequest.IsOverridenByRegkey = 3;
  _TargetCache_LLC = this;
  for (ClientRequest.Override = 0; ClientRequest.Override < 0x11e;
      ClientRequest.Override = ClientRequest.Override + 1) {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (&Mocs.L3,CommonULT::pGmmULTClientContext,ClientRequest.Override);
    Mocs.LeCC.DwordValue = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    register0x00000000 =
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))
                   (CommonULT::pGmmULTClientContext,Mocs.LeCC.DwordValue);
    local_78[1] = 0;
    local_78[0] = gtest_ar.message_.ptr_._4_4_ >> 6 & 1;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_70,"0",(int *)"Mocs.LeCC.AOM",local_78 + 1,local_78);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(local_90);
      pMVar2 = testing::Message::operator<<(local_90,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": AOM is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x71,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    local_b0[1] = 0;
    local_b0[0] = gtest_ar.message_.ptr_._4_4_ >> 0xf & 3;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_a8,"0",(int *)"Mocs.LeCC.CoS",local_b0 + 1,local_b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pMVar2 = testing::Message::operator<<(&local_b8,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": CoS is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x72,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    local_d8[1] = 0;
    local_d8[0] = gtest_ar.message_.ptr_._4_4_ >> 0xb & 7;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_d0,"0",(int *)"Mocs.LeCC.PFM",local_d8 + 1,local_d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pMVar2 = testing::Message::operator<<(&local_e0,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": PFM is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x73,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    local_100[1] = 0;
    local_100[0] = gtest_ar.message_.ptr_._4_4_ >> 8 & 7;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_f8,"0",(int *)"Mocs.LeCC.SCC",local_100 + 1,local_100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pMVar2 = testing::Message::operator<<(&local_108,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": SCC is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x74,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_108);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    local_128[1] = 0;
    local_128[0] = gtest_ar.message_.ptr_._4_4_ >> 0xe & 1;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_120,"0",(int *)"Mocs.LeCC.SCF",local_128 + 1,local_128);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pMVar2 = testing::Message::operator<<(&local_130,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": SCF is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x75,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_130);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    local_150[1] = 0;
    local_150[0] = gtest_ar.message_.ptr_._4_4_ >> 0x11 & 3;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_148,"0",(int *)"Mocs.LeCC.SelfSnoop",local_150 + 1,local_150);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pMVar2 = testing::Message::operator<<(&local_158,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [25])": Self Snoop is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x76,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_158);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    local_178[1] = 0;
    local_178[0] = gtest_ar.message_.ptr_._4_4_ >> 7 & 1;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_170,"0",(int *)"Mocs.LeCC.ESC",local_178 + 1,local_178);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_180);
      pMVar2 = testing::Message::operator<<(&local_180,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [18])": ESC is non-zero");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_180);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    local_1a0[1] = 0;
    local_1a0[0] = gtest_ar.message_.ptr_._4_4_ >> 0x13;
    testing::internal::EqHelper<true>::Compare<int,unsigned_int>
              ((char *)local_198,"0",(int *)"Mocs.LeCC.Reserved",local_1a0 + 1,local_1a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      pMVar2 = testing::Message::operator<<(&local_1a8,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [29])0x228425);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x78,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_1a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
    local_1c8 = (ulong)(ClientRequest.IDCode >> 4 & 3);
    local_1cc = gtest_ar.message_.ptr_._4_4_ >> 4 & 3;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_int>
              ((EqHelper<false> *)local_1c0,"ClientRequest.AGE","Mocs.LeCC.LRUM",&local_1c8,
               &local_1cc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      pMVar2 = testing::Message::operator<<(&local_1d8,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [25])": Incorrect AGE settings");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x7b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
    if (((ClientRequest.IDCode & 1) == 0) && ((ClientRequest.IDCode >> 1 & 1) == 0)) {
      local_1f4 = gtest_ar.message_.ptr_._4_4_ & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_1f0,"LeCC_UNCACHEABLE","Mocs.LeCC.Cacheability",&Usage,
                 &local_1f4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_200);
        pMVar2 = testing::Message::operator<<(&local_200,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [42])": Incorrect LLC/eDRAM cachebility setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                   ,0x7f,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_200);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    }
    else {
      local_21c = gtest_ar.message_.ptr_._4_4_ & 3;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_218,"LeCC_WB_CACHEABLE","Mocs.LeCC.Cacheability",
                 &ClientRequest.IsOverridenByRegkey,&local_21c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
      if (!bVar1) {
        testing::Message::Message(&local_228);
        pMVar2 = testing::Message::operator<<(&local_228,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [42])": Incorrect LLC/eDRAM cachebility setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                   ,0x83,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,pMVar2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_228);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
      if (((ClientRequest.IDCode & 1) == 0) || ((ClientRequest.IDCode >> 1 & 1) != 0)) {
        if (((ClientRequest.IDCode & 1) == 0) && ((ClientRequest.IDCode >> 1 & 1) != 0)) {
          local_26c = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
          testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                    ((EqHelper<false> *)local_268,"TargetCache_ELLC","Mocs.LeCC.TargetCache",
                     &TargetCache_LLC_ELLC,&local_26c);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
          if (!bVar1) {
            testing::Message::Message(&local_278);
            pMVar2 = testing::Message::operator<<(&local_278,(char (*) [8])"Usage# ");
            pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
            pMVar2 = testing::Message::operator<<
                               (pMVar2,(char (*) [33])": Incorrect target cache setting");
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                       ,0x8b,pcVar3);
            testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,pMVar2)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
            testing::Message::~Message(&local_278);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
        }
        else {
          local_294 = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
          testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                    ((EqHelper<false> *)local_290,"TargetCache_LLC_ELLC","Mocs.LeCC.TargetCache",
                     &LeCC_WB_CACHEABLE,&local_294);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
          if (!bVar1) {
            testing::Message::Message(&local_2a0);
            pMVar2 = testing::Message::operator<<(&local_2a0,(char (*) [8])"Usage# ");
            pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
            pMVar2 = testing::Message::operator<<
                               (pMVar2,(char (*) [33])": Incorrect target cache setting");
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                       ,0x8f,pcVar3);
            testing::internal::AssertHelper::operator=(&local_2a8,pMVar2);
            testing::internal::AssertHelper::~AssertHelper(&local_2a8);
            testing::Message::~Message(&local_2a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
        }
      }
      else {
        local_244 = gtest_ar.message_.ptr_._4_4_ >> 2 & 3;
        testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                  ((EqHelper<false> *)local_240,"TargetCache_LLC","Mocs.LeCC.TargetCache",
                   &LeCC_UNCACHEABLE,&local_244);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
        if (!bVar1) {
          testing::Message::Message(&local_250);
          pMVar2 = testing::Message::operator<<(&local_250,(char (*) [8])"Usage# ");
          pMVar2 = testing::Message::operator<<(pMVar2,&ClientRequest.Override);
          pMVar2 = testing::Message::operator<<
                             (pMVar2,(char (*) [33])": Incorrect target cache setting");
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                     ,0x87,pcVar3);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,pMVar2);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(&local_250);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
      }
    }
  }
  return;
}

Assistant:

void CTestGen9CachePolicy::CheckLlcEdramCachePolicy()
{
    const uint32_t TargetCache_ELLC     = 0;
    const uint32_t TargetCache_LLC      = 1;
    const uint32_t TargetCache_LLC_ELLC = 2;

    const uint32_t LeCC_UNCACHEABLE  = 0x1;
    const uint32_t LeCC_WB_CACHEABLE = 0x3;

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                     AssignedMocsIdx = ClientRequest.MemoryObjectOverride.Gen9.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);

        // Check for unused fields
        EXPECT_EQ(0, Mocs.LeCC.AOM) << "Usage# " << Usage << ": AOM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.CoS) << "Usage# " << Usage << ": CoS is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.PFM) << "Usage# " << Usage << ": PFM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SCF) << "Usage# " << Usage << ": SCF is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SelfSnoop) << "Usage# " << Usage << ": Self Snoop is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";

        // Check for age
        EXPECT_EQ(ClientRequest.AGE, Mocs.LeCC.LRUM) << "Usage# " << Usage << ": Incorrect AGE settings";

        if(!ClientRequest.LLC && !ClientRequest.ELLC) // Uncached
        {
            EXPECT_EQ(LeCC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC/eDRAM cachebility setting";
        }
        else
        {
            EXPECT_EQ(LeCC_WB_CACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC/eDRAM cachebility setting";

            if(ClientRequest.LLC && !ClientRequest.ELLC) // LLC only
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";
            }
            else if(!ClientRequest.LLC && ClientRequest.ELLC) // eLLC only
            {
                EXPECT_EQ(TargetCache_ELLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";
            }
            else
            {
                EXPECT_EQ(TargetCache_LLC_ELLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";
            }
        }
    }
}